

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_untransformed_generic(int count,QT_FT_Span *spans,void *userData)

{
  long lVar1;
  char cVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  anon_class_48_9_5c990f07 local_118;
  Operator op;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,spans,count);
  local_118.const_alpha = *(int *)((long)userData + 0xe8);
  local_118.yoff =
       -(int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                      0x3fe0000000000000) - *(double *)((long)userData + 0x78));
  local_118.xoff =
       -(int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                      0x3fe0000000000000) - *(double *)((long)userData + 0x70));
  local_118._25_3_ = 0xaaaaaa;
  local_118.solidSource =
       op.destFetch != destFetchARGB32P &&
       (local_118.const_alpha == 0x100 && op.mode == CompositionMode_Source);
  local_118.image_width = (int)*(undefined8 *)((long)userData + 0xb0);
  local_118.image_height = (int)((ulong)*(undefined8 *)((long)userData + 0xb0) >> 0x20);
  uVar6 = (long)(count + 0x20) / 0x40 & 0xffffffff;
  local_118.op = &op;
  local_118.spans = spans;
  local_118.data = (QSpanData *)userData;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((0x5f < count) && (pQVar3 != (QThreadPool *)0x0)) &&
     (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
    QThread::currentThread();
    cVar2 = QThreadPool::contains((QThread *)pQVar3);
    if (cVar2 == '\0') {
      _semaphore = &DAT_aaaaaaaaaaaaaaaa;
      iVar7 = 0;
      QSemaphore::QSemaphore(&semaphore,0);
      while( true ) {
        iVar8 = (int)uVar6;
        uVar6 = (ulong)(iVar8 - 1);
        if (iVar8 == 0) break;
        iVar8 = (count - iVar7) / iVar8;
        puVar4 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar4 + 1) = 1;
        *puVar4 = QFactoryLoader::keyMap;
        puVar5 = (undefined8 *)operator_new(0x20);
        *puVar5 = QRunnable::QGenericRunnable::
                  Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4409:5)>
                  ::impl;
        *(int *)(puVar5 + 1) = iVar7;
        *(int *)((long)puVar5 + 0xc) = iVar8;
        puVar5[2] = &local_118;
        puVar5[3] = &semaphore;
        puVar4[2] = puVar5;
        QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
        iVar7 = iVar7 + iVar8;
      }
      QSemaphore::acquire((int)&semaphore);
      QSemaphore::~QSemaphore(&semaphore);
      goto LAB_005aa54d;
    }
  }
  blend_untransformed_generic::anon_class_48_9_5c990f07::operator()(&local_118,0,count);
LAB_005aa54d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_generic(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    const int const_alpha = data->texture.const_alpha;
    const int xoff = -qRound(-data->dx);
    const int yoff = -qRound(-data->dy);
    const bool solidSource = op.mode == QPainter::CompositionMode_Source && const_alpha == 256 && op.destFetch != destFetchARGB32P;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED uint buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED uint src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            const bool fetchDest = !solidSource || spans[c].coverage < 255;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    const int coverage = (spans[c].coverage * const_alpha) >> 8;
                    while (length) {
                        int l = qMin(BufferSize, length);
                        const uint *src = op.srcFetch(src_buffer, &op, data, sy, sx, l);
                        uint *dest = fetchDest ? op.destFetch(buffer, data->rasterBuffer, x, spans[c].y, l) : buffer;
                        op.func(dest, src, l, coverage);
                        if (op.destStore)
                            op.destStore(data->rasterBuffer, x, spans[c].y, dest, l);
                        x += l;
                        sx += l;
                        length -= l;
                    }
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}